

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::SetCV(ON_NurbsSurface *this,int i,int j,ON_4dPoint *point)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  bool bVar4;
  double dVar5;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  pdVar3 = CV(this,i,j);
  if (pdVar3 == (double *)0x0) {
    bVar4 = false;
  }
  else if (this->m_is_rat == 0) {
    dVar1 = point->w;
    bVar4 = (bool)(-(dVar1 != 0.0) & 1);
    dVar5 = 1.0 / dVar1;
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      dVar5 = 1.0;
    }
    *pdVar3 = point->x * dVar5;
    iVar2 = this->m_dim;
    if ((1 < iVar2) && (pdVar3[1] = point->y * dVar5, iVar2 != 2)) {
      pdVar3[2] = dVar5 * point->z;
    }
  }
  else {
    *pdVar3 = point->x;
    iVar2 = this->m_dim;
    if ((1 < (long)iVar2) && (pdVar3[1] = point->y, iVar2 != 2)) {
      pdVar3[2] = point->z;
    }
    pdVar3[iVar2] = point->w;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool 
ON_NurbsSurface::SetCV( int i, int j, const ON_4dPoint& point )
{
  DestroySurfaceTree();

  bool rc = false;
  double* cv = CV(i,j);
  if ( cv ) {
    if ( m_is_rat ) {
      cv[0] = point.x;
      if ( m_dim > 1 ) {
        cv[1] = point.y;
        if ( m_dim > 2 )
          cv[2] = point.z;
      }
      cv[m_dim] = point.w;
      rc = true;
    }
    else {
      double w;
      if ( point.w != 0.0 ) {
        w = 1.0/point.w;
        rc = true;
      }
      else {
        w = 1.0;
      }
      cv[0] = w*point.x;
      if ( m_dim > 1 ) {
        cv[1] = w*point.y;
        if ( m_dim > 2 ) {
          cv[2] = w*point.z;
        }
      }
    }
  }
  return rc;
}